

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,size_t startpos,size_t endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  ostringstream *poVar1;
  unsigned_short *puVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  byte *pbVar7;
  Prog *pPVar8;
  StringPiece *pSVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  byte *__s1;
  ulong uVar15;
  MatchKind kind;
  ulong uVar16;
  byte *__s2;
  Anchor AVar17;
  Anchor anchor;
  bool bVar18;
  bool dfa_failed;
  ulong local_218;
  undefined8 local_210;
  ulong local_208;
  ulong local_200;
  Options *local_1f8;
  StringPiece *local_1f0;
  StringPiece local_1e8;
  StringPiece local_1d8;
  StringPiece match;
  LogMessage local_1b0;
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
               ,0x244);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    goto LAB_001adfd2;
  }
  if (startpos <= endpos) {
    uVar15 = text->size_;
    if (endpos < uVar15 || endpos - uVar15 == 0) {
      __s2 = (byte *)(text->data_ + startpos);
      local_1e8.data_ = (const_pointer)__s2;
      local_1e8.size_ = (text->size_ - startpos) + (endpos - uVar15);
      match.data_ = (const_pointer)0x0;
      match.size_ = 0;
      pSVar9 = (StringPiece *)0x0;
      if (nsubmatch != 0) {
        pSVar9 = &match;
      }
      uVar3 = this->num_captures_ + 1;
      if (nsubmatch <= this->num_captures_) {
        uVar3 = nsubmatch;
      }
      uVar16 = (ulong)uVar3;
      pPVar8 = this->prog_;
      bVar4 = pPVar8->anchor_start_;
      if ((startpos != 0 & bVar4) != 0) {
        return false;
      }
      if ((bVar4 == false) || (AVar17 = ANCHOR_BOTH, pPVar8->anchor_end_ == false)) {
        AVar17 = ANCHOR_START;
        if (bVar4 == false) {
          AVar17 = re_anchor;
        }
        if (re_anchor == ANCHOR_BOTH) {
          AVar17 = re_anchor;
        }
      }
      local_208 = (this->prefix_)._M_string_length;
      local_210 = pPVar8;
      local_1f0 = text;
      if (local_208 == 0) {
        local_1f8 = &this->options_;
        bVar13 = (int)uVar3 < 6 & this->is_one_pass_;
        bVar4 = (this->options_).longest_match_;
        kind = (MatchKind)bVar4;
        bVar18 = (pPVar8->list_heads_).ptr_._M_t.
                 super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl !=
                 (unsigned_short *)0x0;
        uVar12 = (ulong)(int)(0x40000 / (long)pPVar8->list_count_);
        dfa_failed = false;
        if (AVar17 == ANCHOR_START) {
LAB_001ae172:
          if (bVar13 != 0) goto LAB_001ae2d2;
          bVar13 = 0;
          goto LAB_001ae2fd;
        }
        if (AVar17 == ANCHOR_BOTH) {
          kind = kFullMatch;
          goto LAB_001ae172;
        }
        local_210._4_4_ = (undefined4)((ulong)pPVar8 >> 0x20);
        local_210 = (Prog *)CONCAT44(local_210._4_4_,(uint)bVar4);
        local_218 = uVar16;
        local_200 = uVar12;
        bVar4 = Prog::SearchDFA(pPVar8,&local_1e8,text,kUnanchored,(uint)bVar4,pSVar9,&dfa_failed,
                                (SparseSet *)0x0);
        if (!bVar4) {
          anchor = kUnanchored;
          if (dfa_failed != true) {
            return false;
          }
          if ((this->options_).log_errors_ == true) {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x29a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
            poVar6 = (ostream *)
                     std::ostream::operator<<((ostream *)&local_1b0.str_,this->prog_->size_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bytemap range ",0xe);
            poVar6 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar6,this->prog_->bytemap_range_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"list count ",0xb);
            std::ostream::operator<<((ostream *)poVar6,this->prog_->list_count_);
            LogMessage::~LogMessage(&local_1b0);
            local_208 = 0;
            anchor = kUnanchored;
          }
          else {
            local_208 = 0;
          }
          goto LAB_001ae47d;
        }
        if (nsubmatch == 0) {
          return true;
        }
        pPVar8 = ReverseProg(this);
        if (pPVar8 == (Prog *)0x0) {
          return false;
        }
        bVar4 = Prog::SearchDFA(pPVar8,&match,local_1f0,kAnchored,kLongestMatch,&match,&dfa_failed,
                                (SparseSet *)0x0);
        if (!bVar4) {
          bVar4 = (this->options_).log_errors_;
          if (dfa_failed != true) {
            if (bVar4 == false) {
              return false;
            }
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x2b7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"SearchDFA inconsistency",0x17);
            goto LAB_001adfd2;
          }
          if (bVar4 != false) {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x2af);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_1b0.str_,pPVar8->size_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bytemap range ",0xe);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pPVar8->bytemap_range_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"list count ",0xb);
            std::ostream::operator<<((ostream *)poVar6,pPVar8->list_count_);
            LogMessage::~LogMessage(&local_1b0);
          }
          local_208 = 0;
          anchor = kUnanchored;
          uVar12 = local_200;
          uVar16 = local_218;
          kind = (MatchKind)local_210;
          goto LAB_001ae494;
        }
        local_208 = 0;
LAB_001ae369:
        uVar16 = local_218;
        if ((int)local_218 < 2) {
          if ((int)local_218 == 1) {
            submatch->data_ = match.data_;
            submatch->size_ = match.size_;
          }
          goto LAB_001ae5e6;
        }
        kind = kFullMatch;
        anchor = kAnchored;
        bVar4 = false;
        pSVar9 = &match;
        uVar12 = local_200;
      }
      else {
        local_1f8 = (Options *)CONCAT44(local_1f8._4_4_,AVar17);
        if (startpos != 0) {
          return false;
        }
        uVar12 = local_1e8.size_ - local_208;
        if (local_1e8.size_ < local_208) {
          return false;
        }
        __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
        local_218 = uVar15;
        if (this->prefix_foldcase_ == true) {
          if (0 < (long)local_208) {
            pbVar7 = __s1 + local_208;
            pbVar11 = __s2;
            do {
              bVar13 = *pbVar11;
              bVar14 = bVar13 | 0x20;
              if (0x19 < (byte)(bVar13 + 0xbf)) {
                bVar14 = bVar13;
              }
              if (*__s1 != bVar14) {
                return false;
              }
              __s1 = __s1 + 1;
              pbVar11 = pbVar11 + 1;
            } while (__s1 < pbVar7);
          }
        }
        else {
          iVar5 = bcmp(__s1,__s2,local_208);
          AVar17 = (Anchor)local_1f8;
          if (iVar5 != 0) {
            return false;
          }
        }
        local_1e8.data_ = (const_pointer)(__s2 + local_208);
        local_1e8.size_ = uVar12;
        if (AVar17 == ANCHOR_BOTH) {
          puVar2 = (local_210->list_heads_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          iVar5 = (int)(0x40000 / (long)local_210->list_count_);
          kind = kFullMatch;
        }
        else {
          puVar2 = (local_210->list_heads_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          kind = (MatchKind)(this->options_).longest_match_;
          iVar5 = (int)(0x40000 / (long)local_210->list_count_);
        }
        bVar13 = 0;
        bVar18 = puVar2 != (unsigned_short *)0x0;
        uVar12 = (ulong)iVar5;
        uVar15 = local_218;
        if ((this->is_one_pass_ & (int)uVar3 < 6) == 0) {
LAB_001ae2fd:
          pPVar8 = local_210;
          local_1f8 = &this->options_;
          dfa_failed = false;
          if ((bVar18) && (uVar15 <= uVar12 && 1 < (int)uVar3)) {
            anchor = kAnchored;
            bVar18 = true;
          }
          else {
            local_210 = (Prog *)CONCAT44(local_210._4_4_,kind);
            local_218 = uVar16;
            local_200 = uVar12;
            bVar4 = Prog::SearchDFA(pPVar8,&local_1e8,local_1f0,kAnchored,kind,&match,&dfa_failed,
                                    (SparseSet *)0x0);
            if (bVar4) goto LAB_001ae369;
            if (dfa_failed != true) {
              return false;
            }
            anchor = kAnchored;
            if (local_1f8->log_errors_ == true) {
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                         ,0x2d7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0.str_,"DFA out of memory: size ",0x18);
              poVar6 = (ostream *)
                       std::ostream::operator<<((ostream *)&local_1b0.str_,this->prog_->size_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bytemap range ",0xe);
              poVar6 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar6,this->prog_->bytemap_range_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"list count ",0xb);
              std::ostream::operator<<((ostream *)poVar6,this->prog_->list_count_);
              LogMessage::~LogMessage(&local_1b0);
            }
LAB_001ae47d:
            uVar12 = local_200;
            uVar16 = local_218;
            kind = (MatchKind)local_210;
          }
        }
        else {
LAB_001ae2d2:
          local_1f8 = &this->options_;
          dfa_failed = false;
          bVar13 = 1;
          if (0x1000 < uVar15) goto LAB_001ae2fd;
          anchor = kAnchored;
          bVar13 = 1;
          if (8 < uVar15 && (int)uVar3 < 2) goto LAB_001ae2fd;
        }
LAB_001ae494:
        bVar4 = true;
        pSVar9 = &local_1e8;
      }
      local_1d8.data_ = pSVar9->data_;
      local_1d8.size_ = pSVar9->size_;
      iVar5 = (int)uVar16;
      if (bVar13 == 1 && anchor != kUnanchored) {
        bVar18 = Prog::SearchOnePass(this->prog_,&local_1d8,local_1f0,kAnchored,kind,submatch,iVar5)
        ;
        if (bVar18) goto LAB_001ae5e6;
        if (bVar4) {
          return false;
        }
        if (local_1f8->log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x2f9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"SearchOnePass inconsistency",0x1b);
      }
      else if ((bool)(bVar18 & local_1d8.size_ <= uVar12)) {
        bVar18 = Prog::SearchBitState(this->prog_,&local_1d8,local_1f0,anchor,kind,submatch,iVar5);
        if (bVar18) {
LAB_001ae5e6:
          if ((0 < nsubmatch) && (local_208 != 0)) {
            submatch->data_ = submatch->data_ + -local_208;
            submatch->size_ = submatch->size_ + local_208;
          }
          iVar5 = (int)uVar16;
          if (iVar5 < nsubmatch) {
            lVar10 = (long)nsubmatch - (long)iVar5;
            pSVar9 = submatch + iVar5;
            do {
              pSVar9->data_ = (const_pointer)0x0;
              pSVar9->size_ = 0;
              pSVar9 = pSVar9 + 1;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            return true;
          }
          return true;
        }
        if (bVar4) {
          return false;
        }
        if (local_1f8->log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x300);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"SearchBitState inconsistency",0x1c);
      }
      else {
        bVar18 = Prog::SearchNFA(this->prog_,&local_1d8,local_1f0,anchor,kind,submatch,iVar5);
        if (bVar18) goto LAB_001ae5e6;
        if (bVar4) {
          return false;
        }
        if (local_1f8->log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x306);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"SearchNFA inconsistency",0x17);
      }
      goto LAB_001adfd2;
    }
  }
  if ((this->options_).log_errors_ != true) {
    return false;
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
             ,0x24a);
  poVar1 = &local_1b0.str_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"RE2: invalid startpos, endpos pair. [",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"startpos: ",10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"endpos: ",8);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"text size: ",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
LAB_001adfd2:
  LogMessage::~LogMessage(&local_1b0);
  return false;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                size_t startpos,
                size_t endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  size_t prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = prefix_.size();
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // BitState allocates a bitmap of size prog_->list_count() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->list_count() * text.size(), but in practice is
  // much smaller.
  const int kMaxBitStateBitmapSize = 256*1024;  // bitmap size <= max (bits)
  bool can_bit_state = prog_->CanBitState();
  size_t bit_state_text_max = kMaxBitStateBitmapSize / prog_->list_count();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog->size() << ", "
                       << "bytemap range " << prog->bytemap_range() << ", "
                       << "list count " << prog->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        if (options_.log_errors())
          LOG(ERROR) << "SearchDFA inconsistency";
        return false;
      }
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].data() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = StringPiece();
  return true;
}